

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O2

bool __thiscall
embree::FastAllocator::Block::hasType(Block *this,AllocationType atype_i,bool huge_pages_i)

{
  bool bVar1;
  
  bVar1 = true;
  if (atype_i != ANY_TYPE) {
    if (this->atype == EMBREE_OS_MALLOC) {
      return this->huge_pages == huge_pages_i && atype_i == EMBREE_OS_MALLOC;
    }
    bVar1 = this->atype == atype_i;
  }
  return bVar1;
}

Assistant:

bool hasType(AllocationType atype_i, bool huge_pages_i) const
      {
        if      (atype_i == ANY_TYPE ) return true;
        else if (atype   == EMBREE_OS_MALLOC) return atype_i == atype && huge_pages_i == huge_pages;
        else                           return atype_i == atype;
      }